

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1552.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  CURLcode CVar3;
  CURLMcode CVar4;
  undefined8 uVar5;
  long lVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  CURLMcode ec_7;
  undefined1 local_8c [4];
  undefined1 auStack_88 [4];
  int num;
  CURLcode local_74;
  CURLcode local_70;
  CURLMcode ec_6;
  CURLMcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_50;
  int local_44;
  long lStack_40;
  int counter;
  CURLMsg *msg;
  CURLcode local_30;
  int res;
  int i;
  int still_running;
  CURLM *multi;
  CURL *curls;
  char *URL_local;
  
  multi = (CURLM *)0x0;
  _i = 0;
  local_30 = CURLE_OK;
  msg._4_4_ = CURLE_OK;
  local_44 = 3;
  curls = (CURL *)URL;
  _ec_1 = tutil_tvnow();
  tv_test_start.tv_sec = _ec_1;
  tv_test_start.tv_usec = local_50;
  CVar3 = curl_global_init(3);
  uVar2 = _stderr;
  ec_2 = CVar3;
  if (CVar3 != CURLE_OK) {
    uVar5 = curl_easy_strerror(CVar3);
    curl_mfprintf(uVar2,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                  ,0x2a,CVar3,uVar5);
    msg._4_4_ = ec_2;
  }
  if (msg._4_4_ == CURLE_OK) {
    _i = curl_multi_init();
    if (_i == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                    ,0x2c);
      msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CIPHER;
    }
    if (msg._4_4_ == CURLE_OK) {
      multi = (CURLM *)curl_easy_init();
      if (multi == (CURLM *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                      ,0x2e);
        msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CACERT;
      }
      if (msg._4_4_ == CURLE_OK) {
        CVar3 = curl_easy_setopt(multi,0x2712,curls);
        uVar2 = _stderr;
        ec_3 = CVar3;
        if (CVar3 != CURLE_OK) {
          uVar5 = curl_easy_strerror(CVar3);
          curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                        ,0x30,CVar3,uVar5);
          msg._4_4_ = ec_3;
        }
        if (msg._4_4_ == CURLE_OK) {
          CVar3 = curl_easy_setopt(multi,0x2a,1);
          uVar2 = _stderr;
          ec_4 = CVar3;
          if (CVar3 != CURLE_OK) {
            uVar5 = curl_easy_strerror(CVar3);
            curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                          ,0x31,CVar3,uVar5);
            msg._4_4_ = ec_4;
          }
          if (msg._4_4_ == CURLE_OK) {
            CVar4 = curl_easy_setopt(multi,0x29,1);
            uVar2 = _stderr;
            ec_5 = CVar4;
            if (CVar4 != CURLM_OK) {
              uVar5 = curl_easy_strerror(CVar4);
              curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                            ,0x32,CVar4,uVar5);
              msg._4_4_ = ec_5;
            }
            if (msg._4_4_ == CURLE_OK) {
              CVar4 = curl_easy_setopt(multi,0x2715,"u:s");
              uVar2 = _stderr;
              ec_6 = CVar4;
              if (CVar4 != CURLM_OK) {
                uVar5 = curl_easy_strerror(CVar4);
                curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                              ,0x33,CVar4,uVar5);
                msg._4_4_ = ec_6;
              }
              if (msg._4_4_ == CURLE_OK) {
                CVar3 = curl_multi_add_handle(_i,multi);
                uVar2 = _stderr;
                local_70 = CVar3;
                if (CVar3 != CURLE_OK) {
                  uVar5 = curl_multi_strerror(CVar3);
                  curl_mfprintf(uVar2,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                                ,0x35,CVar3,uVar5);
                  msg._4_4_ = local_70;
                }
                if (msg._4_4_ == CURLE_OK) {
                  CVar3 = curl_multi_perform(_i,&res);
                  uVar2 = _stderr;
                  local_74 = CVar3;
                  if (CVar3 == CURLE_OK) {
                    if (res < 0) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                                    ,0x37,res);
                      msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CERTPROBLEM;
                    }
                  }
                  else {
                    uVar5 = curl_multi_strerror(CVar3);
                    curl_mfprintf(uVar2,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                                  ,0x37,CVar3,uVar5);
                    msg._4_4_ = local_74;
                  }
                  if (msg._4_4_ == CURLE_OK) {
                    _auStack_88 = tutil_tvnow();
                    tVar7.tv_usec = tv_test_start.tv_usec;
                    tVar7.tv_sec = tv_test_start.tv_sec;
                    lVar6 = tutil_tvdiff(_auStack_88,tVar7);
                    iVar1 = local_44;
                    if (60000 < lVar6) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                                    ,0x39);
                      msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                      iVar1 = local_44;
                    }
                    while (local_44 = iVar1, msg._4_4_ == CURLE_OK) {
                      if (res != 0) {
                        local_44 = iVar1 + -1;
                      }
                      if (res == 0 || iVar1 == 0) {
                        lStack_40 = curl_multi_info_read(_i,&res);
                        if (lStack_40 != 0) {
                          local_30 = *(CURLcode *)(lStack_40 + 0x10);
                        }
                        break;
                      }
                      msg._4_4_ = curl_multi_wait(_i,0,0,60000,local_8c);
                      if (msg._4_4_ != CURLE_OK) {
                        curl_mprintf("curl_multi_wait() returned %d\n",msg._4_4_);
                        msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_LDAP_INVALID_URL;
                        break;
                      }
                      tVar7 = tutil_tvnow();
                      older.tv_usec = tv_test_start.tv_usec;
                      older.tv_sec = tv_test_start.tv_sec;
                      lVar6 = tutil_tvdiff(tVar7,older);
                      if (60000 < lVar6) {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                                      ,0x44);
                        msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                      }
                      if (msg._4_4_ != CURLE_OK) break;
                      CVar3 = curl_multi_perform(_i,&res);
                      uVar2 = _stderr;
                      if (CVar3 == CURLE_OK) {
                        if (res < 0) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                                        ,0x46,res);
                          msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CERTPROBLEM;
                        }
                      }
                      else {
                        uVar5 = curl_multi_strerror(CVar3);
                        curl_mfprintf(uVar2,"%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                                      ,0x46,CVar3,uVar5);
                        msg._4_4_ = CVar3;
                      }
                      if (msg._4_4_ != CURLE_OK) break;
                      tVar7 = tutil_tvnow();
                      older_00.tv_usec = tv_test_start.tv_usec;
                      older_00.tv_sec = tv_test_start.tv_sec;
                      lVar6 = tutil_tvdiff(tVar7,older_00);
                      iVar1 = local_44;
                      if (60000 < lVar6) {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1552.c"
                                      ,0x48);
                        msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                        iVar1 = local_44;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_multi_cleanup(_i);
    curl_easy_cleanup(multi);
    curl_global_cleanup();
    if (msg._4_4_ != CURLE_OK) {
      local_30 = msg._4_4_;
    }
    URL_local._4_4_ = local_30;
  }
  else {
    URL_local._4_4_ = msg._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = 0;
  int res = 0;
  CURLMsg *msg;
  int counter = 3;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);
  easy_setopt(curls, CURLOPT_VERBOSE, 1L);
  easy_setopt(curls, CURLOPT_USERPWD, "u:s");

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running && counter--) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}